

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::MergeFrom
          (CodeGeneratorResponse_File *this,CodeGeneratorResponse_File *from)

{
  byte bVar1;
  uint uVar2;
  LogMessage *other;
  string *psVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/plugin.pb.cc"
               ,0x2ff);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  bVar1 = (byte)from->_has_bits_[0];
  uVar2 = (uint)bVar1;
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 1;
      psVar3 = this->name_;
      if (psVar3 == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar3 = (string *)operator_new(0x20);
        (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
        psVar3->_M_string_length = 0;
        (psVar3->field_2)._M_local_buf[0] = '\0';
        this->name_ = psVar3;
      }
      std::__cxx11::string::_M_assign((string *)psVar3);
      uVar2 = from->_has_bits_[0];
    }
    if ((uVar2 & 2) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 2;
      psVar3 = this->insertion_point_;
      if (psVar3 == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar3 = (string *)operator_new(0x20);
        (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
        psVar3->_M_string_length = 0;
        (psVar3->field_2)._M_local_buf[0] = '\0';
        this->insertion_point_ = psVar3;
      }
      std::__cxx11::string::_M_assign((string *)psVar3);
      uVar2 = from->_has_bits_[0];
    }
    if ((uVar2 & 4) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 4;
      psVar3 = this->content_;
      if (psVar3 == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar3 = (string *)operator_new(0x20);
        (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
        psVar3->_M_string_length = 0;
        (psVar3->field_2)._M_local_buf[0] = '\0';
        this->content_ = psVar3;
      }
      std::__cxx11::string::_M_assign((string *)psVar3);
    }
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void CodeGeneratorResponse_File::MergeFrom(const CodeGeneratorResponse_File& from) {
  GOOGLE_CHECK_NE(&from, this);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_insertion_point()) {
      set_insertion_point(from.insertion_point());
    }
    if (from.has_content()) {
      set_content(from.content());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}